

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O1

void PrintEnterBlock(ParseGraphContext *ctx,char *name,char *format,...)

{
  OutputContext *this;
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  PrintIndent(ctx);
  if (*name != '\0') {
    this = ctx->output;
    sVar1 = strlen(name);
    OutputContext::Print(this,name,(uint)sVar1);
    OutputContext::Print(ctx->output,": ",2);
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &args[0].overflow_arg_area;
  local_f8.gp_offset = 0x18;
  local_f8.fp_offset = 0x30;
  OutputContext::Print(ctx->output,format,&local_f8);
  OutputContext::Print(ctx->output,"{\n",2);
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ParseGraphContext &ctx, const char *name, const char *format, ...)
{
	PrintIndent(ctx);

	if(*name)
	{
		ctx.output.Print(name);
		ctx.output.Print(": ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print("{\n");

	ctx.depth++;
}